

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf_v4::set_ext_geom
          (xr_ogf_v4 *this,xr_vbuf_vec *ext_vbufs,xr_ibuf_vec *ext_ibufs,xr_swibuf_vec *ext_swibufs)

{
  pointer pxVar1;
  pointer pxVar2;
  pointer pxVar3;
  ogf4_slide_window *poVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (this->super_xr_ogf).m_loaded;
  if ((uVar5 & 0x200080) != 0) {
    uVar6 = (ulong)this->m_ext_vb_index;
    pxVar1 = (ext_vbufs->super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(ext_vbufs->
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pxVar1 >> 4) * -0x3333333333333333;
    if (uVar7 < uVar6 || uVar7 - uVar6 == 0) goto LAB_00181dda;
    xr_vbuf::proxy(&(this->super_xr_ogf).m_vb,pxVar1 + uVar6,(ulong)this->m_ext_vb_offset,
                   (ulong)this->m_ext_vb_size);
    uVar5 = (this->super_xr_ogf).m_loaded;
  }
  if ((uVar5 & 0x200100) != 0) {
    uVar6 = (ulong)this->m_ext_ib_index;
    pxVar2 = (ext_ibufs->super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(ext_ibufs->
                      super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pxVar2 >> 5) <= uVar6)
    goto LAB_00181dda;
    xr_ibuf::proxy(&(this->super_xr_ogf).m_ib,pxVar2 + uVar6,(ulong)this->m_ext_ib_offset,
                   (ulong)this->m_ext_ib_size);
    uVar5 = (this->super_xr_ogf).m_loaded;
  }
  if ((uVar5 >> 0x14 & 1) == 0) {
    if ((uVar5 & 0x40) == 0) {
      return;
    }
  }
  else {
    uVar6 = (ulong)this->m_ext_swib_index;
    pxVar3 = (ext_swibufs->
             super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(ext_swibufs->
                   super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pxVar3 >> 4) *
            -0x5555555555555555;
    if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
LAB_00181dda:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
    }
    xr_swibuf::proxy(&this->m_swib,pxVar3 + uVar6);
  }
  poVar4 = (this->m_swib).m_slide_windows;
  xr_ibuf::proxy(&this->m_ib0,&(this->super_xr_ogf).m_ib,(ulong)poVar4->offset,
                 (ulong)poVar4->num_tris * 3);
  return;
}

Assistant:

void xr_ogf_v4::set_ext_geom(const xr_vbuf_vec& ext_vbufs,
		const xr_ibuf_vec& ext_ibufs, const xr_swibuf_vec& ext_swibufs)
{
	if (is_chunk_loaded(OGF4_VCONTAINER) || is_chunk_loaded(OGF4_GCONTAINER))
		m_vb.proxy(ext_vbufs.at(m_ext_vb_index), m_ext_vb_offset, m_ext_vb_size);
	if (is_chunk_loaded(OGF4_ICONTAINER) || is_chunk_loaded(OGF4_GCONTAINER))
		m_ib.proxy(ext_ibufs.at(m_ext_ib_index), m_ext_ib_offset, m_ext_ib_size);
	if (is_chunk_loaded(OGF4_SWICONTAINER)) {
		m_swib.proxy(ext_swibufs.at(m_ext_swib_index));
		setup_ib0();
	} else if (is_chunk_loaded(OGF4_SWIDATA)) {
		setup_ib0();
	}
}